

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_keep_newer_files.c
# Opt level: O1

void test_option_keep_newer_files(void)

{
  wchar_t wVar1;
  
  extract_reference_file("test_option_keep_newer_files.tar.Z");
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_keep_newer_files.c"
                     ,L'\x11',"test1",L'ǭ');
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_keep_newer_files.c"
                  ,L'\x12',"test1");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_keep_newer_files.c"
                      ,L'\x13',"file",L'Ƥ',L'\xffffffff',"new");
  wVar1 = systemf("%s -xf ../%s >test.out 2>test.err",testprog,"test_option_keep_newer_files.tar.Z")
  ;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_keep_newer_files.c"
                      ,L'\x15',0,"0",(long)wVar1,
                      "systemf(\"%s -xf ../%s >test.out 2>test.err\", testprog, reffile)",
                      (void *)0x0);
  assertion_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_keep_newer_files.c"
             ,L'\x16',"old\n",L'\x04',"file");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_keep_newer_files.c"
             ,L'\x17',"test.out");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_keep_newer_files.c"
             ,L'\x18',"test.err");
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_keep_newer_files.c"
                  ,L'\x19',"..");
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_keep_newer_files.c"
                     ,L'\x1c',"test2",L'ǭ');
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_keep_newer_files.c"
                  ,L'\x1d',"test2");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_keep_newer_files.c"
                      ,L'\x1e',"file",L'Ƥ',L'\xffffffff',"new");
  wVar1 = systemf("%s -xf ../%s --keep-newer-files >test.out 2>test.err",testprog,
                  "test_option_keep_newer_files.tar.Z");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_keep_newer_files.c"
                      ,L' ',0,"0",(long)wVar1,
                      "systemf(\"%s -xf ../%s --keep-newer-files >test.out 2>test.err\", testprog, reffile)"
                      ,(void *)0x0);
  assertion_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_keep_newer_files.c"
             ,L'!',"new",L'\x03',"file");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_keep_newer_files.c"
             ,L'\"',"test.out");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_keep_newer_files.c"
             ,L'#',"test.err");
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_keep_newer_files.c"
                  ,L'$',"..");
  return;
}

Assistant:

DEFINE_TEST(test_option_keep_newer_files)
{
	const char *reffile = "test_option_keep_newer_files.tar.Z";

	/* Reference file has one entry "file" with a very old timestamp. */
	extract_reference_file(reffile);

	/* Test 1: Without --keep-newer-files */
	assertMakeDir("test1", 0755);
	assertChdir("test1");
	assertMakeFile("file", 0644, "new");
	assertEqualInt(0,
	    systemf("%s -xf ../%s >test.out 2>test.err", testprog, reffile));
	assertFileContents("old\n", 4, "file");
	assertEmptyFile("test.out");
	assertEmptyFile("test.err");
	assertChdir("..");

	/* Test 2: With --keep-newer-files */
	assertMakeDir("test2", 0755);
	assertChdir("test2");
	assertMakeFile("file", 0644, "new");
	assertEqualInt(0,
	    systemf("%s -xf ../%s --keep-newer-files >test.out 2>test.err", testprog, reffile));
	assertFileContents("new", 3, "file");
	assertEmptyFile("test.out");
	assertEmptyFile("test.err");
	assertChdir("..");
}